

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void imguiMaterial(cgltf_material *material)

{
  cgltf_texture *pcVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  char (*in_R8) [2];
  int *in_R9;
  size_t i;
  FmtBuffer local_48;
  
  lVar3 = (long)material - (long)parsedData->materials;
  sVar4 = lVar3 / 0x248;
  i = sVar4;
  ImGui::Text("Name: %s",material->name,lVar3 % 0x248);
  if (material->has_pbr_metallic_roughness != 0) {
    bVar2 = ImGui::TreeNode("PBR Metallic-Roughness");
    if (bVar2) {
      ImGui::Text("Base color factor: {%g, %g, %g, %g}",
                  (double)(material->pbr_metallic_roughness).base_color_factor[0],
                  (double)(material->pbr_metallic_roughness).base_color_factor[1],
                  (double)(material->pbr_metallic_roughness).base_color_factor[2],
                  (double)(material->pbr_metallic_roughness).base_color_factor[3]);
      ImGui::Text("Metallic factor: %g",(double)(material->pbr_metallic_roughness).metallic_factor);
      ImGui::Text("Roughness factor: %g",(double)(material->pbr_metallic_roughness).roughness_factor
                 );
      pcVar1 = (material->pbr_metallic_roughness).base_color_texture.texture;
      if (pcVar1 != (cgltf_texture *)0x0) {
        lVar3 = ((long)pcVar1 - (long)parsedData->textures) / 0x28;
        local_48.start = (char *)scratch._data;
        local_48.end = (char *)scratch._data;
        local_48.size = (int)scratch._size;
        tl::toStringBufferT(&local_48,"Color texture: ");
        tl::fmtBufferAppend<unsigned_long,char[4],int,char[2],int>
                  (&local_48,&i,(char (*) [4])(&gpu::textureSizes + lVar3),
                   (int *)((long)&gpu::textureSizes + lVar3 * 8 + 4),in_R8,in_R9);
        local_48.end[-(ulong)(local_48.size == 0)] = '\0';
        bVar2 = ImGui::TreeNode((char *)scratch._data);
        if (bVar2) {
          imguiTextureView(&(material->pbr_metallic_roughness).base_color_texture,
                           (float *)(&imgui_state::materialTexturesHeights + sVar4));
          ImGui::TreePop();
        }
      }
      pcVar1 = (material->pbr_metallic_roughness).metallic_roughness_texture.texture;
      if (pcVar1 != (cgltf_texture *)0x0) {
        lVar3 = ((long)pcVar1 - (long)parsedData->textures) / 0x28;
        local_48.start = (char *)scratch._data;
        local_48.end = (char *)scratch._data;
        local_48.size = (int)scratch._size;
        tl::toStringBufferT(&local_48,"Metallic-roughness texture: ");
        tl::fmtBufferAppend<unsigned_long,char[4],int,char[2],int>
                  (&local_48,&i,(char (*) [4])(&gpu::textureSizes + lVar3),
                   (int *)((long)&gpu::textureSizes + lVar3 * 8 + 4),in_R8,in_R9);
        local_48.end[-(ulong)(local_48.size == 0)] = '\0';
        bVar2 = ImGui::TreeNode((char *)scratch._data);
        if (bVar2) {
          imguiTextureView(&(material->pbr_metallic_roughness).metallic_roughness_texture,
                           (float *)((long)&imgui_state::materialTexturesHeights + sVar4 * 8 + 4));
          ImGui::TreePop();
        }
      }
      ImGui::TreePop();
    }
  }
  return;
}

Assistant:

static void imguiMaterial(const cgltf_material& material)
{
    const size_t i = getMaterialInd(&material);
    ImGui::Text("Name: %s", material.name);
    if(material.has_pbr_metallic_roughness)
    if(ImGui::TreeNode("PBR Metallic-Roughness"))
    {
        const auto& props = material.pbr_metallic_roughness;
        const auto& colorFactor = props.base_color_factor;
        ImGui::Text("Base color factor: {%g, %g, %g, %g}", colorFactor[0], colorFactor[1], colorFactor[2], colorFactor[3]);
        ImGui::Text("Metallic factor: %g", props.metallic_factor);
        ImGui::Text("Roughness factor: %g", props.roughness_factor);
        if(props.base_color_texture.texture)
        {
            const size_t texInd = getTextureInd(props.base_color_texture.texture);
            tl::toStringBuffer(scratchStr(), "Color texture: ", i, " - ", gpu::textureSizes[texInd].x, "x", gpu::textureSizes[texInd].y);
            if(ImGui::TreeNode(scratchStr())) {
                imguiTextureView(props.base_color_texture, &imgui_state::materialTexturesHeights[i].color);
                ImGui::TreePop();
            }
        }
        if(props.metallic_roughness_texture.texture)
        {
            const size_t texInd = getTextureInd(props.metallic_roughness_texture.texture);
            tl::toStringBuffer(scratchStr(), "Metallic-roughness texture: ", i, " - ", gpu::textureSizes[texInd].x, "x", gpu::textureSizes[texInd].y);
            if(ImGui::TreeNode(scratchStr())) {
                imguiTextureView(props.metallic_roughness_texture, &imgui_state::materialTexturesHeights[i].metallicRoughness);
                ImGui::TreePop();
            }
        }
        ImGui::TreePop();
    }
}